

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

Data processObject(fy_node *node)

{
  void *o_00;
  DataType DVar1;
  fy_node_pair *fynp;
  fy_node *pfVar2;
  Data pvVar3;
  Data data;
  String name;
  Data val;
  Data key;
  fy_node_pair *pair;
  void *iter;
  Object o;
  fy_node *node_local;
  
  o = (Object)node;
  iter = newObject();
  pair = (fy_node_pair *)0x0;
  while( true ) {
    fynp = fy_node_mapping_iterate((fy_node *)o,&pair);
    if (fynp == (fy_node_pair *)0x0) {
      pvVar3 = newDataObject((Object)iter);
      return pvVar3;
    }
    pfVar2 = fy_node_pair_key(fynp);
    pvVar3 = parseYaml(pfVar2);
    pfVar2 = fy_node_pair_value(fynp);
    data = parseYaml(pfVar2);
    if (((pvVar3 == (Data)0x0) || (data == (Data)0x0)) ||
       (DVar1 = getDataType(pvVar3), o_00 = iter, DVar1 != StringType)) break;
    name = valString(pvVar3);
    putObject((Object)o_00,name,data);
    shallowFreeData(pvVar3);
  }
  if (pvVar3 != (Data)0x0) {
    deepFreeData(pvVar3);
  }
  if (data != (Data)0x0) {
    deepFreeData(data);
  }
  freeObject((Object)iter);
  return (Data)0x0;
}

Assistant:

Data processObject(struct fy_node *node) {
    Object o = newObject();
    void *iter = NULL;
    struct fy_node_pair *pair;
    Data key, val;
    while ((pair = fy_node_mapping_iterate(node, &iter))) {
        key = parseYaml(fy_node_pair_key(pair));
        val = parseYaml(fy_node_pair_value(pair));
        if (key == NULL || val == NULL || getDataType(key) != StringType) {
            if (key != NULL)deepFreeData(key);
            if (val != NULL)deepFreeData(val);
            freeObject(o);
            return NULL;
        }
        putObject(o, valString(key), val);
        shallowFreeData(key);
    }
    return newDataObject(o);
}